

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FileOptions::MergeFrom(FileOptions *this,FileOptions *from)

{
  int *piVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  UninterpretedOption *from_00;
  void **ppvVar6;
  LogMessage *other;
  UninterpretedOption *this_00;
  string *psVar7;
  long lVar8;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x133d);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ +
             (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      from_00 = (UninterpretedOption *)
                (from->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar8];
      iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar4 < iVar5) {
        ppvVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        this_00 = (UninterpretedOption *)ppvVar6[iVar4];
      }
      else {
        iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar5 == iVar4) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar4 + 1);
        }
        piVar1 = &(this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption>::New();
        ppvVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
        iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        ppvVar6[iVar4] = this_00;
      }
      UninterpretedOption::MergeFrom(this_00,from_00);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  bVar2 = (byte)from->_has_bits_[0];
  if (bVar2 != 0) {
    if ((bVar2 & 1) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      if (this->java_package_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar7 = (string *)operator_new(0x20);
        (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
        psVar7->_M_string_length = 0;
        (psVar7->field_2)._M_local_buf[0] = '\0';
        this->java_package_ = psVar7;
      }
      std::__cxx11::string::_M_assign((string *)this->java_package_);
    }
    if ((from->_has_bits_[0] & 2) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      if (this->java_outer_classname_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar7 = (string *)operator_new(0x20);
        (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
        psVar7->_M_string_length = 0;
        (psVar7->field_2)._M_local_buf[0] = '\0';
        this->java_outer_classname_ = psVar7;
      }
      std::__cxx11::string::_M_assign((string *)this->java_outer_classname_);
    }
    if ((from->_has_bits_[0] & 4) != 0) {
      bVar3 = from->java_multiple_files_;
      this->_has_bits_[0] = this->_has_bits_[0] | 4;
      this->java_multiple_files_ = bVar3;
    }
    if ((from->_has_bits_[0] & 8) != 0) {
      bVar3 = from->java_generate_equals_and_hash_;
      this->_has_bits_[0] = this->_has_bits_[0] | 8;
      this->java_generate_equals_and_hash_ = bVar3;
    }
    if ((from->_has_bits_[0] & 0x10) != 0) {
      iVar4 = from->optimize_for_;
      if (2 < iVar4 - 1U) {
        __assert_fail("::google::protobuf::FileOptions_OptimizeMode_IsValid(value)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/descriptor.pb.h"
                      ,0x128c,
                      "void google::protobuf::FileOptions::set_optimize_for(::google::protobuf::FileOptions_OptimizeMode)"
                     );
      }
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x10;
      this->optimize_for_ = iVar4;
    }
    if ((from->_has_bits_[0] & 0x20) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 0x20;
      if (this->go_package_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar7 = (string *)operator_new(0x20);
        (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
        psVar7->_M_string_length = 0;
        (psVar7->field_2)._M_local_buf[0] = '\0';
        this->go_package_ = psVar7;
      }
      std::__cxx11::string::_M_assign((string *)this->go_package_);
    }
    if ((from->_has_bits_[0] & 0x40) != 0) {
      bVar3 = from->cc_generic_services_;
      this->_has_bits_[0] = this->_has_bits_[0] | 0x40;
      this->cc_generic_services_ = bVar3;
    }
    if ((from->_has_bits_[0] & 0x80) != 0) {
      bVar3 = from->java_generic_services_;
      this->_has_bits_[0] = this->_has_bits_[0] | 0x80;
      this->java_generic_services_ = bVar3;
    }
  }
  if ((from->_has_bits_[0] & 0x100) != 0) {
    bVar3 = from->py_generic_services_;
    this->_has_bits_[0] = this->_has_bits_[0] | 0x100;
    this->py_generic_services_ = bVar3;
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void FileOptions::MergeFrom(const FileOptions& from) {
  GOOGLE_CHECK_NE(&from, this);
  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_java_package()) {
      set_java_package(from.java_package());
    }
    if (from.has_java_outer_classname()) {
      set_java_outer_classname(from.java_outer_classname());
    }
    if (from.has_java_multiple_files()) {
      set_java_multiple_files(from.java_multiple_files());
    }
    if (from.has_java_generate_equals_and_hash()) {
      set_java_generate_equals_and_hash(from.java_generate_equals_and_hash());
    }
    if (from.has_optimize_for()) {
      set_optimize_for(from.optimize_for());
    }
    if (from.has_go_package()) {
      set_go_package(from.go_package());
    }
    if (from.has_cc_generic_services()) {
      set_cc_generic_services(from.cc_generic_services());
    }
    if (from.has_java_generic_services()) {
      set_java_generic_services(from.java_generic_services());
    }
  }
  if (from._has_bits_[8 / 32] & (0xffu << (8 % 32))) {
    if (from.has_py_generic_services()) {
      set_py_generic_services(from.py_generic_services());
    }
  }
  _extensions_.MergeFrom(from._extensions_);
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}